

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,uint *key,FieldAccessStatsEntry **value)

{
  BaseDictionary<unsigned_int,Js::ScriptContext::FieldAccessStatsEntry*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  hash_t hashCode;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry> local_58;
  uint *local_50;
  FieldAccessStatsEntry **local_48;
  WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry> *local_40;
  uint local_34;
  
  lVar7 = *(long *)this;
  if (lVar7 == 0) {
    BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar7 = *(long *)this;
  }
  hashCode = *key * 2 + 1;
  local_34 = BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket((BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          *)this,hashCode);
  uVar9 = 0;
  piVar8 = (int *)(lVar7 + (ulong)local_34 * 4);
  while (-1 < (long)*piVar8) {
    lVar7 = (long)*piVar8 * 0x10;
    if (*(uint *)(*(long *)(this + 8) + 0xc + lVar7) == *key) {
      if (*(DictionaryStats **)(this + 0x30) == (DictionaryStats *)0x0) {
        return -1;
      }
      DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar9);
      return -1;
    }
    uVar9 = uVar9 + 1;
    piVar8 = (int *)(lVar7 + *(long *)(this + 8) + 8);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar9);
  }
  local_50 = key;
  local_48 = value;
  if (*(int *)(this + 0x28) == 0) {
    iVar5 = *(int *)(this + 0x18);
    iVar10 = *(int *)(this + 0x20);
    if (iVar10 == iVar5) {
      BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      local_34 = BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket((BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                              *)this,hashCode);
      iVar5 = *(int *)(this + 0x18);
      iVar10 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar10 + 1;
    if (iVar5 < iVar10 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar4) goto LAB_0070579a;
      *puVar6 = 0;
      iVar5 = *(int *)(this + 0x18);
    }
    if (iVar5 <= iVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar4) goto LAB_0070579a;
      *puVar6 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar4) goto LAB_0070579a;
      *puVar6 = 0;
    }
    iVar10 = *(int *)(this + 0x24);
    if (iVar10 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar4) goto LAB_0070579a;
      *puVar6 = 0;
      iVar10 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar4) {
LAB_0070579a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      iVar10 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar5 = BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar10 * 0x10 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar5;
    }
  }
  lVar7 = *(long *)(this + 8);
  lVar11 = (long)iVar10 * 0x10;
  local_40 = (WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry> *)(lVar7 + lVar11);
  Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>::WriteBarrierSet
            (&local_58,*local_48);
  Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>::WriteBarrierSet
            (local_40,local_58.ptr);
  *(uint *)(lVar7 + 0xc + lVar11) = *local_50;
  lVar7 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  *(undefined4 *)(lVar2 + 8 + lVar11) = *(undefined4 *)(lVar7 + (ulong)local_34 * 4);
  *(int *)(lVar7 + (ulong)local_34 * 4) = iVar10;
  uVar9 = 0;
  iVar5 = iVar10;
  do {
    iVar5 = *(int *)(lVar2 + 8 + (long)iVar5 * 0x10);
    uVar9 = uVar9 + 1;
  } while (iVar5 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar9);
  }
  return iVar10;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }